

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.hpp
# Opt level: O0

tuple<int,_int,_int> __thiscall
mxx::right_shift<std::tuple<int,int,int>>(mxx *this,tuple<int,_int,_int> *t,comm *comm)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  MPI_Datatype poVar4;
  MPI_Comm poVar5;
  _Head_base<0UL,_int,_false> extraout_EDX;
  tuple<int,_int,_int> tVar6;
  undefined1 local_48 [8];
  MPI_Request recv_req;
  undefined1 local_38 [4];
  int tag;
  datatype dt;
  comm *comm_local;
  tuple<int,_int,_int> *t_local;
  tuple<int,_int,_int> *left_value;
  
  dt._16_8_ = comm;
  get_datatype<std::tuple<int,int,int>>();
  recv_req._4_4_ = 0xd;
  std::tuple<int,_int,_int>::tuple<void,_true>((tuple<int,_int,_int> *)this);
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar2) {
    poVar4 = datatype::type((datatype *)local_38);
    iVar2 = mxx::comm::rank((comm *)dt._16_8_);
    uVar1 = recv_req._4_4_;
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Irecv(this,1,poVar4,iVar2 + -1,uVar1,poVar5,local_48);
  }
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  iVar3 = mxx::comm::size((comm *)dt._16_8_);
  if (iVar2 < iVar3 + -1) {
    poVar4 = datatype::type((datatype *)local_38);
    iVar2 = mxx::comm::rank((comm *)dt._16_8_);
    uVar1 = recv_req._4_4_;
    poVar5 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Send(t,1,poVar4,iVar2 + 1,uVar1,poVar5);
  }
  iVar2 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar2) {
    MPI_Wait(local_48,0);
  }
  datatype::~datatype((datatype *)local_38);
  tVar6.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       extraout_EDX._M_head_impl;
  tVar6.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar6.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

T right_shift(const T& t, const mxx::comm& comm = mxx::comm()) {
    // get datatype
    datatype dt = get_datatype<T>();

    // TODO: handle tags with MXX (get unique tag function)
    int tag = 13;

    T left_value = T();
    MPI_Request recv_req;
    // if not last processor
    if (comm.rank() > 0) {
        MPI_Irecv(&left_value, 1, dt.type(), comm.rank()-1, tag,
                  comm, &recv_req);
    }
    // if not first processor
    if (comm.rank() < comm.size()-1) {
        // send my most right element to the right
        MPI_Send(const_cast<T*>(&t), 1, dt.type(), comm.rank()+1, tag, comm);
    }
    if (comm.rank() > 0) {
        // wait for the async receive to finish
        MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
    }
    return left_value;
}